

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointLimitConstraint.cpp
# Opt level: O1

void __thiscall
btMultiBodyJointLimitConstraint::createConstraintRows
          (btMultiBodyJointLimitConstraint *this,btMultiBodyConstraintArray *constraintRows,
          btMultiBodyJacobianData *data,btContactSolverInfo *infoGlobal)

{
  btScalar *pbVar1;
  btMultiBodySolverConstraint *solverConstraint;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  eFeatherstoneJointType eVar6;
  float *pfVar7;
  btMultibodyLink *pbVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  void *pvVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  bool bVar20;
  btScalar bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  btScalar bVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  btQuaternion q;
  btVector3 local_48;
  
  if ((this->super_btMultiBodyConstraint).m_numDofsFinalized !=
      (this->super_btMultiBodyConstraint).m_jacSizeBoth) {
    (*(this->super_btMultiBodyConstraint)._vptr_btMultiBodyConstraint[2])(this);
  }
  bVar21 = btMultiBody::getJointPos
                     ((this->super_btMultiBodyConstraint).m_bodyA,
                      (this->super_btMultiBodyConstraint).m_linkA);
  (this->super_btMultiBodyConstraint).m_data.m_data[(this->super_btMultiBodyConstraint).m_posOffset]
       = bVar21 - this->m_lowerBound;
  fVar22 = this->m_upperBound;
  bVar21 = btMultiBody::getJointPos
                     ((this->super_btMultiBodyConstraint).m_bodyA,
                      (this->super_btMultiBodyConstraint).m_linkA);
  (this->super_btMultiBodyConstraint).m_data.m_data
  [(long)(this->super_btMultiBodyConstraint).m_posOffset + 1] = fVar22 - bVar21;
  if (0 < (this->super_btMultiBodyConstraint).m_numRows) {
    iVar19 = 0;
    do {
      iVar4 = *(int *)(constraintRows + 4);
      if (iVar4 == *(int *)(constraintRows + 8)) {
        iVar18 = iVar4 * 2;
        if (iVar4 == 0) {
          iVar18 = 1;
        }
        if (*(int *)(constraintRows + 8) < iVar18) {
          if (iVar18 == 0) {
            pvVar15 = (void *)0x0;
          }
          else {
            pvVar15 = btAlignedAllocInternal((long)iVar18 * 0xe0,0x10);
          }
          iVar5 = *(int *)(constraintRows + 4);
          if (0 < (long)iVar5) {
            lVar17 = 0;
            do {
              memcpy((void *)(lVar17 + (long)pvVar15),
                     (void *)(*(long *)(constraintRows + 0x10) + lVar17),0xe0);
              lVar17 = lVar17 + 0xe0;
            } while ((long)iVar5 * 0xe0 - lVar17 != 0);
          }
          if (*(void **)(constraintRows + 0x10) != (void *)0x0) {
            if (constraintRows[0x18] == (btMultiBodyConstraintArray)0x1) {
              btAlignedFreeInternal(*(void **)(constraintRows + 0x10));
            }
            *(undefined8 *)(constraintRows + 0x10) = 0;
          }
          constraintRows[0x18] = (btMultiBodyConstraintArray)0x1;
          *(void **)(constraintRows + 0x10) = pvVar15;
          *(int *)(constraintRows + 8) = iVar18;
        }
      }
      fVar22 = (float)(int)(-(uint)(iVar19 != 0) | 1);
      *(int *)(constraintRows + 4) = *(int *)(constraintRows + 4) + 1;
      lVar17 = *(long *)(constraintRows + 0x10);
      lVar16 = (long)iVar4 * 0xe0;
      solverConstraint = (btMultiBodySolverConstraint *)(lVar17 + lVar16);
      *(btMultiBodyJointLimitConstraint **)(lVar17 + 0xd0 + lVar16) = this;
      *(int *)(lVar17 + 0xd8 + lVar16) = iVar19;
      *(btMultiBody **)(lVar17 + 0xb0 + lVar16) = (this->super_btMultiBodyConstraint).m_bodyA;
      *(btMultiBody **)(lVar17 + 0xc0 + lVar16) = (this->super_btMultiBodyConstraint).m_bodyB;
      local_48.m_floats[0] = 0.0;
      local_48.m_floats[1] = 0.0;
      local_48.m_floats[2] = 0.0;
      local_48.m_floats[3] = 0.0;
      lVar17 = (long)(this->super_btMultiBodyConstraint).m_jacSizeBoth * (long)iVar19 +
               (long)(this->super_btMultiBodyConstraint).m_numRows;
      pfVar7 = (this->super_btMultiBodyConstraint).m_data.m_data;
      bVar21 = btMultiBodyConstraint::fillMultiBodyConstraint
                         (&this->super_btMultiBodyConstraint,solverConstraint,data,pfVar7 + lVar17,
                          pfVar7 + (long)(int)lVar17 +
                                   (long)(this->super_btMultiBodyConstraint).m_jacSizeA,&local_48,
                          &local_48,&local_48,0.0,infoGlobal,0.0,
                          (this->super_btMultiBodyConstraint).m_maxAppliedImpulse,1.0,false,0.0,0.0)
      ;
      iVar4 = (this->super_btMultiBodyConstraint).m_linkA;
      pbVar8 = (((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data;
      eVar6 = pbVar8[iVar4].m_jointType;
      if (eVar6 == ePrismatic) {
        btMatrix3x3::getRotation(&pbVar8[iVar4].m_cachedWorldTransform.m_basis,&q);
        fVar23 = q.super_btQuadWord.m_floats[2];
        fVar24 = q.super_btQuadWord.m_floats[3];
        iVar4 = (this->super_btMultiBodyConstraint).m_linkA;
        pbVar8 = (((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data;
        fVar26 = pbVar8[iVar4].m_axes[0].m_bottomVec.m_floats[2];
        uVar2 = *(undefined8 *)pbVar8[iVar4].m_axes[0].m_bottomVec.m_floats;
        uVar3 = *(undefined8 *)(pbVar8[iVar4].m_axes[0].m_bottomVec.m_floats + 1);
        fVar27 = (float)uVar2;
        fVar33 = (float)((ulong)uVar2 >> 0x20);
        fVar32 = q.super_btQuadWord.m_floats[0];
        fVar25 = (fVar24 * fVar33 + fVar23 * fVar27) - fVar32 * fVar26;
        fVar29 = q.super_btQuadWord.m_floats[1];
        fVar30 = (fVar26 * fVar24 + (float)uVar3 * fVar32) - fVar29 * fVar27;
        fVar31 = (fVar27 * fVar24 + (float)((ulong)uVar3 >> 0x20) * fVar29) - fVar23 * fVar33;
        fVar34 = -fVar29;
        fVar35 = -fVar23;
        fVar27 = fVar26 * fVar35 + (fVar33 * fVar34 - fVar27 * fVar32);
        fVar26 = (fVar25 * fVar32 + fVar31 * fVar34 + fVar27 * fVar35 + fVar30 * fVar24) * fVar22;
        fVar29 = fVar22 * (fVar29 * fVar30 + fVar35 * fVar25 + -fVar32 * fVar27 + fVar31 * fVar24);
        fVar22 = fVar22 * (fVar23 * fVar31 + -fVar32 * fVar30 + fVar34 * fVar27 + fVar25 * fVar24);
        auVar12._4_4_ = fVar22;
        auVar12._0_4_ = fVar29;
        auVar12._8_4_ = fVar26;
        auVar12._12_4_ = 0;
        *(undefined1 (*) [16])(solverConstraint->m_contactNormal1).m_floats = auVar12;
        auVar14._8_4_ = -fVar26;
        auVar14._0_8_ = CONCAT44(fVar22,fVar29) ^ 0x8000000080000000;
        auVar14._12_4_ = 0;
        *(undefined1 (*) [16])(solverConstraint->m_contactNormal2).m_floats = auVar14;
        (solverConstraint->m_relpos1CrossNormal).m_floats[0] = 0.0;
        (solverConstraint->m_relpos1CrossNormal).m_floats[1] = 0.0;
        (solverConstraint->m_relpos1CrossNormal).m_floats[2] = 0.0;
        (solverConstraint->m_relpos1CrossNormal).m_floats[3] = 0.0;
        (solverConstraint->m_relpos2CrossNormal).m_floats[0] = 0.0;
        (solverConstraint->m_relpos2CrossNormal).m_floats[1] = 0.0;
        (solverConstraint->m_relpos2CrossNormal).m_floats[2] = 0.0;
        (solverConstraint->m_relpos2CrossNormal).m_floats[3] = 0.0;
      }
      else if (eVar6 == eRevolute) {
        (solverConstraint->m_contactNormal1).m_floats[0] = 0.0;
        (solverConstraint->m_contactNormal1).m_floats[1] = 0.0;
        (solverConstraint->m_contactNormal1).m_floats[2] = 0.0;
        (solverConstraint->m_contactNormal1).m_floats[3] = 0.0;
        (solverConstraint->m_contactNormal2).m_floats[0] = 0.0;
        (solverConstraint->m_contactNormal2).m_floats[1] = 0.0;
        (solverConstraint->m_contactNormal2).m_floats[2] = 0.0;
        (solverConstraint->m_contactNormal2).m_floats[3] = 0.0;
        btMatrix3x3::getRotation
                  (&(((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data
                    [(this->super_btMultiBodyConstraint).m_linkA].m_cachedWorldTransform.m_basis,&q)
        ;
        fVar23 = q.super_btQuadWord.m_floats[2];
        fVar24 = q.super_btQuadWord.m_floats[3];
        iVar4 = (this->super_btMultiBodyConstraint).m_linkA;
        pbVar8 = (((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data;
        fVar26 = pbVar8[iVar4].m_axes[0].m_topVec.m_floats[2];
        uVar2 = *(undefined8 *)pbVar8[iVar4].m_axes[0].m_topVec.m_floats;
        uVar3 = *(undefined8 *)(pbVar8[iVar4].m_axes[0].m_topVec.m_floats + 1);
        fVar27 = (float)uVar2;
        fVar33 = (float)((ulong)uVar2 >> 0x20);
        fVar32 = q.super_btQuadWord.m_floats[0];
        fVar25 = (fVar24 * fVar33 + fVar23 * fVar27) - fVar32 * fVar26;
        fVar29 = q.super_btQuadWord.m_floats[1];
        fVar30 = (fVar26 * fVar24 + (float)uVar3 * fVar32) - fVar29 * fVar27;
        fVar31 = (fVar27 * fVar24 + (float)((ulong)uVar3 >> 0x20) * fVar29) - fVar23 * fVar33;
        fVar34 = -fVar29;
        fVar35 = -fVar23;
        fVar27 = fVar26 * fVar35 + (fVar33 * fVar34 - fVar27 * fVar32);
        fVar26 = (fVar25 * fVar32 + fVar31 * fVar34 + fVar27 * fVar35 + fVar30 * fVar24) * fVar22;
        fVar29 = fVar22 * (fVar29 * fVar30 + fVar35 * fVar25 + -fVar32 * fVar27 + fVar31 * fVar24);
        fVar22 = fVar22 * (fVar23 * fVar31 + -fVar32 * fVar30 + fVar34 * fVar27 + fVar25 * fVar24);
        auVar11._4_4_ = fVar22;
        auVar11._0_4_ = fVar29;
        auVar11._8_4_ = fVar26;
        auVar11._12_4_ = 0;
        *(undefined1 (*) [16])(solverConstraint->m_relpos1CrossNormal).m_floats = auVar11;
        auVar13._8_4_ = -fVar26;
        auVar13._0_8_ = CONCAT44(fVar22,fVar29) ^ 0x8000000080000000;
        auVar13._12_4_ = 0;
        *(undefined1 (*) [16])(solverConstraint->m_relpos2CrossNormal).m_floats = auVar13;
      }
      fVar22 = (this->super_btMultiBodyConstraint).m_data.m_data
               [(long)(this->super_btMultiBodyConstraint).m_posOffset + (long)iVar19];
      bVar20 = (infoGlobal->super_btContactSolverInfoData).m_splitImpulse != 0;
      pbVar1 = &(infoGlobal->super_btContactSolverInfoData).m_splitImpulsePenetrationThreshold;
      bVar9 = fVar22 == *pbVar1;
      bVar10 = fVar22 < *pbVar1;
      if (fVar22 <= 0.0) {
        bVar21 = -bVar21;
        fVar22 = (-fVar22 *
                 (&(infoGlobal->super_btContactSolverInfoData).m_erp)[(bVar10 || bVar9) && bVar20])
                 / (infoGlobal->super_btContactSolverInfoData).m_timeStep;
      }
      else {
        bVar21 = -fVar22 / (infoGlobal->super_btContactSolverInfoData).m_timeStep;
        fVar22 = 0.0;
      }
      fVar22 = fVar22 * solverConstraint->m_jacDiagABInv;
      bVar21 = bVar21 * solverConstraint->m_jacDiagABInv;
      if (!bVar10 && !bVar9 || !bVar20) {
        bVar21 = bVar21 + fVar22;
      }
      bVar28 = 0.0;
      if ((bVar10 || bVar9) && bVar20) {
        bVar28 = fVar22;
      }
      solverConstraint->m_rhs = bVar21;
      solverConstraint->m_rhsPenetration = bVar28;
      iVar19 = iVar19 + 1;
    } while (iVar19 < (this->super_btMultiBodyConstraint).m_numRows);
  }
  return;
}

Assistant:

void btMultiBodyJointLimitConstraint::createConstraintRows(btMultiBodyConstraintArray& constraintRows,
		btMultiBodyJacobianData& data,
		const btContactSolverInfo& infoGlobal)
{
	
    // only positions need to be updated -- data.m_jacobians and force
    // directions were set in the ctor and never change.

	if (m_numDofsFinalized != m_jacSizeBoth)
	{
        finalizeMultiDof();
	}


    // row 0: the lower bound
    setPosition(0, m_bodyA->getJointPos(m_linkA) - m_lowerBound);			//multidof: this is joint-type dependent

    // row 1: the upper bound
    setPosition(1, m_upperBound - m_bodyA->getJointPos(m_linkA));
	
	for (int row=0;row<getNumRows();row++)
	{
		
		btScalar direction = row? -1 : 1;

		btMultiBodySolverConstraint& constraintRow = constraintRows.expandNonInitializing();
        constraintRow.m_orgConstraint = this;
        constraintRow.m_orgDofIndex = row;
        
		constraintRow.m_multiBodyA = m_bodyA;
		constraintRow.m_multiBodyB = m_bodyB;
		const btScalar posError = 0;						//why assume it's zero?
		const btVector3 dummy(0, 0, 0);

		btScalar rel_vel = fillMultiBodyConstraint(constraintRow,data,jacobianA(row),jacobianB(row),dummy,dummy,dummy,posError,infoGlobal,0,m_maxAppliedImpulse);

		{
			//expect either prismatic or revolute joint type for now
			btAssert((m_bodyA->getLink(m_linkA).m_jointType == btMultibodyLink::eRevolute)||(m_bodyA->getLink(m_linkA).m_jointType == btMultibodyLink::ePrismatic));
			switch (m_bodyA->getLink(m_linkA).m_jointType)
			{
				case btMultibodyLink::eRevolute:
				{
					constraintRow.m_contactNormal1.setZero();
					constraintRow.m_contactNormal2.setZero();
					btVector3 revoluteAxisInWorld = direction*quatRotate(m_bodyA->getLink(m_linkA).m_cachedWorldTransform.getRotation(),m_bodyA->getLink(m_linkA).m_axes[0].m_topVec);
					constraintRow.m_relpos1CrossNormal=revoluteAxisInWorld;
					constraintRow.m_relpos2CrossNormal=-revoluteAxisInWorld;
					
					break;
				}
				case btMultibodyLink::ePrismatic:
				{
					btVector3 prismaticAxisInWorld = direction* quatRotate(m_bodyA->getLink(m_linkA).m_cachedWorldTransform.getRotation(),m_bodyA->getLink(m_linkA).m_axes[0].m_bottomVec);
					constraintRow.m_contactNormal1=prismaticAxisInWorld;
					constraintRow.m_contactNormal2=-prismaticAxisInWorld;
					constraintRow.m_relpos1CrossNormal.setZero();
					constraintRow.m_relpos2CrossNormal.setZero();
					
					break;
				}
				default:
				{
					btAssert(0);
				}
			};
			
		}

		{
			btScalar penetration = getPosition(row);
			btScalar positionalError = 0.f;
			btScalar	velocityError =  - rel_vel;// * damping;
			btScalar erp = infoGlobal.m_erp2;
			if (!infoGlobal.m_splitImpulse || (penetration > infoGlobal.m_splitImpulsePenetrationThreshold))
			{
				erp = infoGlobal.m_erp;
			}
			if (penetration>0)
			{
				positionalError = 0;
				velocityError = -penetration / infoGlobal.m_timeStep;
			} else
			{
				positionalError = -penetration * erp/infoGlobal.m_timeStep;
			}

			btScalar  penetrationImpulse = positionalError*constraintRow.m_jacDiagABInv;
			btScalar velocityImpulse = velocityError *constraintRow.m_jacDiagABInv;
			if (!infoGlobal.m_splitImpulse || (penetration > infoGlobal.m_splitImpulsePenetrationThreshold))
			{
				//combine position and velocity into rhs
				constraintRow.m_rhs = penetrationImpulse+velocityImpulse;
				constraintRow.m_rhsPenetration = 0.f;

			} else
			{
				//split position and velocity into rhs and m_rhsPenetration
				constraintRow.m_rhs = velocityImpulse;
				constraintRow.m_rhsPenetration = penetrationImpulse;
			}
		}
	}

}